

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastMinus(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vRes)

{
  uint iData0;
  int *piVar1;
  int iVar2;
  int iCtrl;
  ulong uVar3;
  
  vRes->nSize = 0;
  if (0 < nNum) {
    uVar3 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)nNum != uVar3);
  }
  if (0 < nNum) {
    piVar1 = vRes->pArray;
    uVar3 = 0;
    iCtrl = 0;
    do {
      iData0 = piVar1[uVar3];
      if ((int)iData0 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10e,"int Abc_LitNot(int)");
      }
      iVar2 = Gia_ManHashMux(pNew,iCtrl,iData0 ^ 1,iData0);
      piVar1[uVar3] = iVar2;
      iCtrl = Gia_ManHashOr(pNew,iCtrl,pNum[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)nNum != uVar3);
  }
  return;
}

Assistant:

void Wlc_BlastMinus( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vRes )
{
    int * pRes  = Wlc_VecCopy( vRes, pNum, nNum );
    int i, invert = 0;
    for ( i = 0; i < nNum; i++ )
    {
        pRes[i] = Gia_ManHashMux( pNew, invert, Abc_LitNot(pRes[i]), pRes[i] );
        invert = Gia_ManHashOr( pNew, invert, pNum[i] );    
    }
}